

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

String * __thiscall
kj::PathPtr::toWin32StringImpl
          (String *__return_storage_ptr__,PathPtr *this,bool absolute,bool forApi)

{
  String *pSVar1;
  long lVar2;
  bool bVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  long lVar7;
  undefined7 in_register_00000011;
  long lVar8;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar9;
  ulong uVar10;
  size_t extraout_RDX_01;
  size_t i;
  size_t sVar11;
  Path *pPVar12;
  long lVar13;
  ArrayPtr<const_kj::String> *__range1;
  Path *pPVar14;
  String *params_1;
  char *pcVar15;
  ArrayPtr<const_char> part;
  StringPtr part_00;
  Fault f;
  Fault f_2;
  
  part.size_ = (char (*) [2])CONCAT71(in_register_00000011,absolute);
  sVar9 = (this->parts).size_;
  if (sVar9 == 0) {
    if (absolute) {
      toWin32StringImpl();
      return __return_storage_ptr__;
    }
    str<char_const(&)[2]>(__return_storage_ptr__,(kj *)0x233b8c,part.size_);
    return __return_storage_ptr__;
  }
  if (absolute) {
    pSVar1 = (this->parts).ptr;
    pPVar14 = (Path *)(pSVar1->content).size_;
    pPVar12 = pPVar14;
    if (pPVar14 != (Path *)0x0) {
      pPVar12 = (Path *)(pSVar1->content).ptr;
    }
    pcVar15 = (char *)0x0;
    if (pPVar14 != (Path *)0x0) {
      pcVar15 = (char *)((long)&pPVar14[-1].parts.disposer + 7);
    }
    if (((pcVar15 == (char *)0x2) && (*(char *)((long)&(pPVar12->parts).ptr + 1) == ':')) &&
       ((byte)((*(byte *)&(pPVar12->parts).ptr & 0xdf) + 0xbf) < 0x1a)) {
      lVar7 = 0;
    }
    else {
      part.ptr = pcVar15;
      bVar3 = Path::isNetbiosName(pPVar12,part);
      lVar7 = 1;
      if (!bVar3) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[70],kj::String_const&>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0xd2,FAILED,(char *)0x0,
                   "\"absolute win32 path must start with drive letter or netbios host name\", parts[0]"
                   ,(char (*) [70])
                    "absolute win32 path must start with drive letter or netbios host name",pSVar1);
        _::Debug::Fault::fatal(&f);
      }
    }
  }
  else {
    lVar7 = 0;
    forApi = false;
  }
  uVar6 = lVar7 * 4 + 4;
  if (forApi == false) {
    uVar6 = (ulong)(uint)((int)lVar7 * 2);
  }
  sVar11 = (sVar9 + uVar6) - 1;
  lVar8 = 0;
  do {
    lVar2 = *(long *)((long)&(((this->parts).ptr)->content).size_ + lVar8);
    lVar13 = 0;
    if (lVar2 != 0) {
      lVar13 = lVar2 + -1;
    }
    sVar11 = sVar11 + lVar13;
    lVar8 = lVar8 + 0x18;
  } while (sVar9 * 0x18 != lVar8);
  heapString(__return_storage_ptr__,sVar11);
  pcVar15 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar15 != (char *)0x0) {
    pcVar15 = (__return_storage_ptr__->content).ptr;
  }
  if (forApi == false) {
    if ((char)lVar7 == '\0') goto LAB_00213c25;
    pcVar4 = pcVar15 + 1;
    *pcVar15 = '\\';
    lVar7 = 2;
  }
  else {
    builtin_strncpy(pcVar15,"\\\\?\\",4);
    if ((char)lVar7 == '\0') {
      pcVar15 = pcVar15 + 4;
      goto LAB_00213c25;
    }
    pcVar15[4] = 'U';
    pcVar15[5] = 'N';
    pcVar4 = pcVar15 + 7;
    pcVar15[6] = 'C';
    lVar7 = 8;
  }
  pcVar15 = pcVar15 + lVar7;
  *pcVar4 = '\\';
LAB_00213c25:
  sVar9 = (this->parts).size_;
  if (sVar9 != 0) {
    params_1 = (this->parts).ptr;
    pSVar1 = params_1 + sVar9;
    bVar3 = false;
    sVar9 = extraout_RDX;
    do {
      if (bVar3) {
        *pcVar15 = '\\';
        pcVar15 = pcVar15 + 1;
      }
      pPVar14 = (Path *)(params_1->content).ptr;
      sVar11 = (params_1->content).size_;
      pPVar12 = pPVar14;
      if (sVar11 == 0) {
        pPVar12 = (Path *)0x22a50f;
      }
      part_00.content.ptr = (char *)(sVar11 + (sVar11 == 0));
      part_00.content.size_ = sVar9;
      bVar3 = Path::isWin32Special(pPVar12,part_00);
      if (bVar3) {
        _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[38],kj::String_const&>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                   ,0xf9,FAILED,"!Path::isWin32Special(p)",
                   "\"path cannot contain DOS reserved name\", p",
                   (char (*) [38])"path cannot contain DOS reserved name",params_1);
        if (1 < (params_1->content).size_) {
          uVar6 = 0;
          do {
            pcVar15[uVar6] = '|';
            uVar6 = uVar6 + 1;
            sVar9 = (params_1->content).size_;
            uVar10 = 0;
            if (sVar9 != 0) {
              uVar10 = sVar9 - 1;
            }
          } while (uVar6 < uVar10);
          pcVar15 = pcVar15 + uVar6;
        }
        _::Debug::Fault::~Fault(&f);
        sVar9 = extraout_RDX_01;
      }
      else {
        if (sVar11 == 0) {
          pPVar14 = (Path *)0x0;
        }
        sVar5 = sVar11 - 1;
        if (sVar11 == 0) {
          sVar5 = 0;
        }
        memcpy(pcVar15,pPVar14,sVar5);
        sVar9 = (params_1->content).size_;
        sVar5 = sVar9 - 1;
        if (sVar9 == 0) {
          sVar5 = 0;
        }
        pcVar15 = pcVar15 + sVar5;
        sVar9 = extraout_RDX_00;
      }
      params_1 = params_1 + 1;
      bVar3 = true;
    } while (params_1 != pSVar1);
  }
  sVar9 = (__return_storage_ptr__->content).size_;
  pcVar4 = (__return_storage_ptr__->content).ptr + (sVar9 - 1);
  if (sVar9 == 0) {
    pcVar4 = (char *)0x0;
  }
  if (pcVar15 == pcVar4) {
    lVar7 = 0;
    if (sVar9 != 0) {
      lVar7 = sVar9 - 1;
    }
    if (sVar9 != 0 && sVar9 - 1 != 0) {
      lVar8 = 0;
      do {
        if (((__return_storage_ptr__->content).ptr[lVar8] == ':') &&
           ((ulong)forApi * 4 + 1 != lVar8 || !absolute)) {
          _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[80],kj::String&>
                    (&f,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x113,FAILED,(char *)0x0,
                     "\"colons are prohibited in win32 paths to avoid triggering alterante data streams\", result"
                     ,(char (*) [80])
                      "colons are prohibited in win32 paths to avoid triggering alterante data streams"
                     ,__return_storage_ptr__);
          (__return_storage_ptr__->content).ptr[lVar8] = '|';
          _::Debug::Fault::~Fault(&f);
        }
        lVar8 = lVar8 + 1;
      } while (lVar7 != lVar8);
    }
    return __return_storage_ptr__;
  }
  f_2.exception = (Exception *)0x0;
  f.exception = (Exception *)0x0;
  _::Debug::Fault::init
            (&f_2,(EVP_PKEY_CTX *)
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
            );
  _::Debug::Fault::fatal(&f_2);
}

Assistant:

String PathPtr::toWin32StringImpl(bool absolute, bool forApi) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    KJ_REQUIRE(!absolute, "absolute path is missing disk designator") {
      break;
    }
    return absolute ? kj::str("\\\\") : kj::str(".");
  }

  bool isUncPath = false;
  if (absolute) {
    if (Path::isWin32Drive(parts[0])) {
      // It's a win32 drive
    } else if (Path::isNetbiosName(parts[0])) {
      isUncPath = true;
    } else {
      KJ_FAIL_REQUIRE("absolute win32 path must start with drive letter or netbios host name",
                      parts[0]);
    }
  } else {
    // Currently we do nothing differently in the forApi case for relative paths.
    forApi = false;
  }

  size_t size = forApi
      ? (isUncPath ? 8 : 4) + (parts.size() - 1)
      : (isUncPath ? 2 : 0) + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = heapString(size);

  char* ptr = result.begin();

  if (forApi) {
    *ptr++ = '\\';
    *ptr++ = '\\';
    *ptr++ = '?';
    *ptr++ = '\\';
    if (isUncPath) {
      *ptr++ = 'U';
      *ptr++ = 'N';
      *ptr++ = 'C';
      *ptr++ = '\\';
    }
  } else {
    if (isUncPath) {
      *ptr++ = '\\';
      *ptr++ = '\\';
    }
  }

  bool leadingSlash = false;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '\\';
    leadingSlash = true;

    KJ_REQUIRE(!Path::isWin32Special(p), "path cannot contain DOS reserved name", p) {
      // Recover by blotting out the name with invalid characters which Win32 syscalls will reject.
      for (size_t i = 0; i < p.size(); i++) {
        *ptr++ = '|';
      }
      goto skip;
    }

    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  skip:;
  }

  KJ_ASSERT(ptr == result.end());

  // Check for colons (other than in drive letter), which on NTFS would be interpreted as an
  // "alternate data stream", which can lead to surprising results. If we want to support ADS, we
  // should do so using an explicit API. Note that this check also prevents a relative path from
  // appearing to start with a drive letter.
  for (size_t i: kj::indices(result)) {
    if (result[i] == ':') {
      if (absolute && i == (forApi ? 5 : 1)) {
        // False alarm: this is the drive letter.
      } else {
        KJ_FAIL_REQUIRE(
            "colons are prohibited in win32 paths to avoid triggering alterante data streams",
            result) {
          // Recover by using a different character which we know Win32 syscalls will reject.
          result[i] = '|';
          break;
        }
      }
    }
  }

  return result;
}